

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O0

int __thiscall CNscContext::GetTypeSize(CNscContext *this,NscType nType)

{
  NscSymbol *pNVar1;
  uchar *puVar2;
  NscType in_ESI;
  long in_RDI;
  NscSymbolStructExtra *pExtra;
  uchar *pauchData;
  NscSymbol *pSymbol;
  CNscContext *in_stack_ffffffffffffffd0;
  
  if (in_ESI == NscType_Action) {
    return 0;
  }
  if (3 < in_ESI - NscType_Integer) {
    if (in_ESI == NscType_Vector) {
      return 3;
    }
    if ((in_ESI != NscType_Engine_2) && (in_ESI != NscType_Engine_7)) {
      if ((0xf < (int)in_ESI) && ((int)in_ESI < 0x20)) {
        return 1;
      }
      if (0x1f < (int)in_ESI) {
        pNVar1 = GetStructSymbol(in_stack_ffffffffffffffd0,in_ESI);
        puVar2 = CNscSymbolTable::GetData
                           ((CNscSymbolTable *)(in_RDI + 0x458),
                            (pNVar1->field_6).field_1.nFirstBackLink);
        return *(int *)(puVar2 + 4);
      }
      return 0;
    }
  }
  return 1;
}

Assistant:

int CNscContext::GetTypeSize (NscType nType)
{

	//
	// Switch based on the type
	//

	switch (nType)
	{
		case NscType_Integer:
		case NscType_Float:
		case NscType_String:
		case NscType_Object:
		case NscType_Engine_2: // location
		case NscType_Engine_7: // json
			return 1;

		case NscType_Vector:
			return 3;

		case NscType_Action:
			return 0;

		//
		// Default case catches all the other types
		//

		default:

			//
			// If this is an engine type
			//

			if (nType >= NscType_Engine_0 &&
				nType < NscType_Struct_0)
			{
				return 1;
			}

			//
			// If we have a structure
			//

			else if (nType >= NscType_Struct_0)
			{

				//
				// Loop through the values in the structure
				// and add them as variables.
				//

				NscSymbol *pSymbol = GetStructSymbol (nType);
				unsigned char *pauchData = m_sSymbols .GetData (pSymbol ->nExtra);
				NscSymbolStructExtra *pExtra = (NscSymbolStructExtra *) pauchData;
				return pExtra ->nTotalSize;
			}

			//
			// Otherwise, error.  Unknown type
			//

			else
			{
				return 0;
			}
			break;
	}
}